

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate.cpp
# Opt level: O2

QList<QByteArray> *
QTimeZonePrivate::windowsIdToIanaIds
          (QList<QByteArray> *__return_storage_ptr__,QByteArray *windowsId,Territory territory)

{
  quint16 qVar1;
  ZoneData *this;
  undefined6 in_register_00000012;
  long in_FS_OFFSET;
  iterator __begin4;
  quint16 in_stack_ffffffffffffff5e;
  QArrayDataPointer<char> local_a0;
  undefined1 local_88 [32];
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  QStringTokenizerBase<QLatin1String,_QChar> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QByteArray *)0x0;
  (__return_storage_ptr__->d).size = 0;
  if ((int)CONCAT62(in_register_00000012,territory) == 0x102) {
    windowsIdToDefaultIanaId((QByteArray *)local_88,windowsId);
    QList<QByteArray>::emplaceBack<QByteArray>(__return_storage_ptr__,(QByteArray *)local_88);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)local_88);
  }
  else {
    qVar1 = toWindowsIdKey(windowsId);
    this = zoneStartForWindowsId(in_stack_ffffffffffffff5e);
    for (; (this != (ZoneData *)&DAT_00533846 && (this->windowsIdKey == qVar1)); this = this + 1) {
      if ((uint)this->territory == (int)(short)territory) {
        local_48.m_haystack = QtTimeZoneCldr::ZoneData::id(this);
        local_48.super_QStringTokenizerBaseBase.m_sb.
        super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.
        super_QFlagsStorage<Qt::SplitBehaviorFlags>.i =
             (QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)0x0;
        local_48.super_QStringTokenizerBaseBase.m_cs = CaseSensitive;
        local_48.m_needle.ucs = L' ';
        local_58 = &DAT_aaaaaaaaaaaaaaaa;
        local_68 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
        local_88._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_88._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QStringTokenizerBase<QLatin1String,_QChar>::iterator::iterator
                  ((iterator *)local_88,&local_48);
        while (local_88[0x18] != false) {
          QByteArray::QByteArray((QByteArray *)&local_a0,(char *)local_88._16_8_,local_88._8_8_);
          QList<QByteArray>::emplaceBack<QByteArray>(__return_storage_ptr__,(QByteArray *)&local_a0)
          ;
          QArrayDataPointer<char>::~QArrayDataPointer(&local_a0);
          QStringTokenizerBase<QLatin1String,_QChar>::iterator::advance((iterator *)local_88);
        }
        break;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<QByteArray> QTimeZonePrivate::windowsIdToIanaIds(const QByteArray &windowsId,
                                                       QLocale::Territory territory)
{
    QList<QByteArray> list;
    if (territory == QLocale::World) {
        // World data are in windowsDataTable, not zoneDataTable.
        list << windowsIdToDefaultIanaId(windowsId);
    } else {
        const quint16 windowsIdKey = toWindowsIdKey(windowsId);
        const qint16 land = static_cast<quint16>(territory);
        for (auto data = zoneStartForWindowsId(windowsIdKey);
             data != std::end(zoneDataTable) && data->windowsIdKey == windowsIdKey;
             ++data) {
            // Return the region matches in preference order
            if (data->territory == land) {
                for (auto l1 : data->ids())
                    list << QByteArray(l1.data(), l1.size());
                break;
            }
        }
    }

    return list;
}